

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

int init_inotify(uv_loop_t *loop)

{
  int iVar1;
  int *piVar2;
  int fd;
  uv_loop_t *loop_local;
  
  if (loop->inotify_fd == -1) {
    iVar1 = inotify_init1(0x80800);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      loop_local._4_4_ = -*piVar2;
    }
    else {
      loop->inotify_fd = iVar1;
      uv__io_init(&loop->inotify_read_watcher,uv__inotify_read,loop->inotify_fd);
      uv__io_start(loop,&loop->inotify_read_watcher,1);
      loop_local._4_4_ = 0;
    }
  }
  else {
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

static int init_inotify(uv_loop_t* loop) {
  int fd;

  if (loop->inotify_fd != -1)
    return 0;

  fd = inotify_init1(IN_NONBLOCK | IN_CLOEXEC);
  if (fd < 0)
    return UV__ERR(errno);

  loop->inotify_fd = fd;
  uv__io_init(&loop->inotify_read_watcher, uv__inotify_read, loop->inotify_fd);
  uv__io_start(loop, &loop->inotify_read_watcher, POLLIN);

  return 0;
}